

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall And::And(And *this,shared_ptr<Token> *t,shared_ptr<Expr> *x1,shared_ptr<Expr> *x2)

{
  element_type *peVar1;
  shared_ptr<Type> local_98;
  shared_ptr<Type> local_88;
  shared_ptr<Type> local_78 [2];
  shared_ptr<Expr> local_58;
  shared_ptr<Expr> local_48;
  shared_ptr<Token> local_38;
  shared_ptr<Expr> *local_28;
  shared_ptr<Expr> *x2_local;
  shared_ptr<Expr> *x1_local;
  shared_ptr<Token> *t_local;
  And *this_local;
  
  local_28 = x2;
  x2_local = x1;
  x1_local = (shared_ptr<Expr> *)t;
  t_local = (shared_ptr<Token> *)this;
  std::shared_ptr<Token>::shared_ptr(&local_38,t);
  std::shared_ptr<Expr>::shared_ptr(&local_48,x1);
  std::shared_ptr<Expr>::shared_ptr(&local_58,x2);
  Logical::Logical(&this->super_Logical,&local_38,&local_48,&local_58);
  std::shared_ptr<Expr>::~shared_ptr(&local_58);
  std::shared_ptr<Expr>::~shared_ptr(&local_48);
  std::shared_ptr<Token>::~shared_ptr(&local_38);
  (this->super_Logical).super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR_toJson_abi_cxx11__0016f588;
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)x1);
  std::shared_ptr<Type>::shared_ptr(&local_88,&peVar1->type);
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)x2);
  std::shared_ptr<Type>::shared_ptr(&local_98,&peVar1->type);
  (*(this->super_Logical).super_Expr.super_Node._vptr_Node[7])(local_78,this,&local_88,&local_98);
  std::shared_ptr<Type>::operator=(&(this->super_Logical).super_Expr.type,local_78);
  std::shared_ptr<Type>::~shared_ptr(local_78);
  std::shared_ptr<Type>::~shared_ptr(&local_98);
  std::shared_ptr<Type>::~shared_ptr(&local_88);
  return;
}

Assistant:

And(std::shared_ptr<Token> t, std::shared_ptr<Expr> x1, std::shared_ptr<Expr> x2) : Logical(t, x1, x2) {
		type = check(x1->type, x2->type);
	}